

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O2

void __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
dijkstra_sssp(uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
             *d,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *prev)

{
  _List_node_base *p_Var1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _List_node_base *p_Var4;
  set<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  PQ;
  anon_class_24_3_3321debf relax;
  undefined1 local_128 [40];
  _Rb_tree<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  anon_class_24_3_3321debf local_d0;
  key_type local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_100._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_100._M_impl.super__Rb_tree_header._M_header;
  local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_100._M_impl.super__Rb_tree_header._M_header._M_right =
       local_100._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(prev,(initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )ZEXT816(0));
  local_d0.PQ = (set<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_100;
  local_d0.d = d;
  local_d0.prev = prev;
  p_Var1 = (_List_node_base *)vertices(this);
  p_Var4 = p_Var1;
  while (p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != p_Var1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
             ::operator[](d,(key_type *)(p_Var4 + 1));
    *pmVar2 = INFINITY;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](prev,(key_type *)(p_Var4 + 1));
    std::__cxx11::string::assign((char *)pmVar3);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
           ::operator[](d,src);
  *pmVar2 = 0.0;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
           ::operator[](d,src);
  std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<float_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_128,pmVar2,src);
  std::
  _Rb_tree<std::pair<float,std::__cxx11::string>,std::pair<float,std::__cxx11::string>,std::_Identity<std::pair<float,std::__cxx11::string>>,std::less<std::pair<float,std::__cxx11::string>>,std::allocator<std::pair<float,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<float,std::__cxx11::string>>
            ((_Rb_tree<std::pair<float,std::__cxx11::string>,std::pair<float,std::__cxx11::string>,std::_Identity<std::pair<float,std::__cxx11::string>>,std::less<std::pair<float,std::__cxx11::string>>,std::allocator<std::pair<float,std::__cxx11::string>>>
              *)&local_100,
             (pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_128);
  std::__cxx11::string::~string((string *)(local_128 + 8));
  while (local_100._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_128,
         (pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(local_100._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    std::
    _Rb_tree<std::pair<float,std::__cxx11::string>,std::pair<float,std::__cxx11::string>,std::_Identity<std::pair<float,std::__cxx11::string>>,std::less<std::pair<float,std::__cxx11::string>>,std::allocator<std::pair<float,std::__cxx11::string>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<float,std::__cxx11::string>,std::pair<float,std::__cxx11::string>,std::_Identity<std::pair<float,std::__cxx11::string>>,std::less<std::pair<float,std::__cxx11::string>>,std::allocator<std::pair<float,std::__cxx11::string>>>
                        *)&local_100,
                       (const_iterator)local_100._M_impl.super__Rb_tree_header._M_header._M_left);
    std::__cxx11::string::string((string *)&local_b8,(string *)(local_128 + 8));
    p_Var1 = (_List_node_base *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>_>_>_>
             ::operator[](&this->adj,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    p_Var4 = p_Var1;
    while (p_Var4 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != p_Var1) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>::
      pair(&local_98,
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>
            *)(p_Var4 + 1));
      std::__cxx11::string::string((string *)&local_50,(string *)(local_128 + 8));
      std::__cxx11::string::string((string *)&local_70,(string *)&local_98);
      dijkstra_sssp::anon_class_24_3_3321debf::operator()
                (&local_d0,&local_50,&local_70,local_98.second);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::__cxx11::string::~string((string *)(local_128 + 8));
  }
  std::
  _Rb_tree<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_100);
  return;
}

Assistant:

void dijkstra_sssp(ver src, map<ver, float> &d, map<ver, ver> &prev) {
      set<pair<float, ver> > PQ;
      prev = {};
      auto relax = [&](ver u, ver v, float wt) {
          if (d[u] + wt < d[v]) {
            //In the set updating of a particular is not possible
            // we have to remove the old pair, and insert the new pair to simulation updating
            if (auto f = PQ.find({d[v], v});
                    f != PQ.end())
              PQ.erase(f);

            //Insert the new pair
            d[v] = d[u] + wt;
            prev[v] = u;
            PQ.insert({d[v], v});
          }
      };
      for (auto &v : vertices()) {
        d[v] = numeric_limits<float>::infinity();//set d[v] = +INF
        prev[v] = "";//set prev[v] -> NIL
      }

      d[src] = 0;
      PQ.insert({d[src], src});

      while (!PQ.empty()) {

        //Find the pair at the front.
        auto[ignore, u] = *(PQ.begin());

        PQ.erase(PQ.begin());
        //Iterate over neighbours/children of the current u
        for (auto[v, wt]: neighbours(u)) {
          relax(u, v, wt);//relax all neighbouring vertices
        }
      }
    }